

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void nite::strSplit(string *input,string *split,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *list)

{
  size_type sVar1;
  int iVar2;
  string *this;
  string local_70;
  string local_50;
  
  if ((list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(list);
  }
  std::__cxx11::string::string((string *)&local_50,(string *)input);
  strRemoveCoin(&local_70,&local_50,split);
  std::__cxx11::string::operator=((string *)input,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  this = &local_50;
  do {
    std::__cxx11::string::~string((string *)this);
    while( true ) {
      while( true ) {
        iVar2 = std::__cxx11::string::find((string *)input,(ulong)split);
        sVar1 = input->_M_string_length;
        if (iVar2 == -1) {
          if (sVar1 != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(list,input);
          }
          return;
        }
        if ((int)sVar1 + -1 != iVar2) break;
        std::__cxx11::string::erase((ulong)input,sVar1 - 1);
      }
      if (iVar2 != 0) break;
      std::__cxx11::string::erase((ulong)input,0);
    }
    subStr(&local_70,input,0,iVar2 - 1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    subStr(&local_70,input,iVar2 + (int)split->_M_string_length,(int)input->_M_string_length - 1);
    std::__cxx11::string::operator=((string *)input,(string *)&local_70);
    this = &local_70;
  } while( true );
}

Assistant:

void nite::strSplit(String input, const String &split, Vector<String> &list){
	if ( !list.size() ){
		list.clear();
	}

	input = nite::strRemoveCoin(input, split);

	while (1){
		int k = input.find(split);

		if (k == -1){
			if (input.length()>0){
				list.push_back(input);
			}
			break;
		}

		if (k == (int)input.length()-1){
			input.erase(input.length()-1, split.length());
			continue;
		}

		if (k == 0){
			input.erase(0, split.length());
			continue;
		}

		list.push_back(subStr(input, 0,k-1));
		input = nite::subStr(input, k+split.length(), input.length()-1);
	}

	return;
}